

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

bool __thiscall cmExportFileGenerator::GenerateImportFile(cmExportFileGenerator *this)

{
  int iVar1;
  cmGeneratedFileStream *this_00;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  undefined1 uVar4;
  string se;
  ostringstream e;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  if (this->AppendMode == true) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x200);
    std::ofstream::ofstream(this_00,(this->MainImportFile)._M_dataplus._M_p,_S_app);
  }
  else {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream
              (this_00,(this->MainImportFile)._M_dataplus._M_p,true);
    cmGeneratedFileStream::SetCopyIfDifferent(this_00,true);
  }
  if (((&(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"# Generated by CMake ",0x15);
    __s = cmVersion::GetCMakeVersion();
    if (__s == (char *)0x0) {
      std::ios::clear((int)this_00 +
                      (int)(this_00->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                           [-3]);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.5)\n"
               ,0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"   message(FATAL_ERROR \"CMake >= 2.6.0 required\")\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"endif()\n",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"cmake_policy(PUSH)\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"cmake_policy(VERSION 2.6)\n",0x1a);
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
    GenerateImportHeaderCode(this,(ostream *)this_00,(string *)local_198);
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
    }
    iVar1 = (*this->_vptr_cmExportFileGenerator[2])(this,this_00);
    uVar4 = (undefined1)iVar1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "# Commands beyond this point should not need to know the version.\n",0x42);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"set(CMAKE_IMPORT_FILE_VERSION)\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"cmake_policy(POP)\n",0x12);
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"cannot write to file \"",0x16);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(this->MainImportFile)._M_dataplus._M_p,
                        (this->MainImportFile)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1d8,local_1d0);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((char *)local_1b8,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    uVar4 = 0;
  }
  (*(this_00->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
    [1])(this_00);
  return (bool)uVar4;
}

Assistant:

bool cmExportFileGenerator::GenerateImportFile()
{
  // Open the output file to generate it.
  cmsys::auto_ptr<cmsys::ofstream> foutPtr;
  if(this->AppendMode)
    {
    // Open for append.
    cmsys::auto_ptr<cmsys::ofstream>
      ap(new cmsys::ofstream(this->MainImportFile.c_str(), std::ios::app));
    foutPtr = ap;
    }
  else
    {
    // Generate atomically and with copy-if-different.
    cmsys::auto_ptr<cmGeneratedFileStream>
      ap(new cmGeneratedFileStream(this->MainImportFile.c_str(), true));
    ap->SetCopyIfDifferent(true);
    foutPtr = ap;
    }
  if(!foutPtr.get() || !*foutPtr)
    {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << this->MainImportFile
      << "\": " << se;
    cmSystemTools::Error(e.str().c_str());
    return false;
    }
  std::ostream& os = *foutPtr;

  // Protect that file against use with older CMake versions.
  os << "# Generated by CMake " << cmVersion::GetCMakeVersion() << "\n\n";
  os << "if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.5)\n"
     << "   message(FATAL_ERROR \"CMake >= 2.6.0 required\")\n"
     << "endif()\n";

  // Isolate the file policy level.
  // We use 2.6 here instead of the current version because newer
  // versions of CMake should be able to export files imported by 2.6
  // until the import format changes.
  os << "cmake_policy(PUSH)\n"
     << "cmake_policy(VERSION 2.6)\n";

  // Start with the import file header.
  this->GenerateImportHeaderCode(os);

  // Create all the imported targets.
  bool result = this->GenerateMainFile(os);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);
  os << "cmake_policy(POP)\n";

  return result;
}